

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestSessionExecutor.cpp
# Opt level: O0

void __thiscall
tcu::TestSessionExecutor::TestSessionExecutor
          (TestSessionExecutor *this,TestPackageRoot *root,TestContext *testCtx)

{
  CommandLine *this_00;
  Archive *archive;
  CaseListFilter *caseListFilter;
  TestContext *testCtx_local;
  TestPackageRoot *root_local;
  TestSessionExecutor *this_local;
  
  this->m_testCtx = testCtx;
  DefaultHierarchyInflater::DefaultHierarchyInflater(&this->m_inflater,testCtx);
  this_00 = TestContext::getCommandLine(testCtx);
  archive = TestContext::getArchive(testCtx);
  CommandLine::createCaseListFilter(&this->m_caseListFilter,this_00,archive);
  caseListFilter =
       de::details::UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>::
       operator*(&(this->m_caseListFilter).
                  super_UniqueBase<tcu::CaseListFilter,_de::DefaultDeleter<tcu::CaseListFilter>_>);
  TestHierarchyIterator::TestHierarchyIterator
            (&this->m_iterator,root,&(this->m_inflater).super_TestHierarchyInflater,caseListFilter);
  de::details::MovePtr<tcu::TestCaseExecutor,_de::DefaultDeleter<tcu::TestCaseExecutor>_>::MovePtr
            (&this->m_caseExecutor);
  TestRunStatus::TestRunStatus(&this->m_status);
  this->m_state = STATE_TRAVERSE_HIERARCHY;
  this->m_abortSession = false;
  this->m_isInTestCase = false;
  this->m_testStartTime = 0;
  return;
}

Assistant:

TestSessionExecutor::TestSessionExecutor (TestPackageRoot& root, TestContext& testCtx)
	: m_testCtx			(testCtx)
	, m_inflater		(testCtx)
	, m_caseListFilter	(testCtx.getCommandLine().createCaseListFilter(testCtx.getArchive()))
	, m_iterator		(root, m_inflater, *m_caseListFilter)
	, m_state			(STATE_TRAVERSE_HIERARCHY)
	, m_abortSession	(false)
	, m_isInTestCase	(false)
	, m_testStartTime	(0)
{
}